

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O0

void Omega_h::transfer_density_error
               (Mesh *old_mesh,TransferOpts *opts,Mesh *new_mesh,CavsByBdryStatus *cavs,
               TagBase *tagbase,LOs *same_ents2old_ents,LOs *same_ents2new_ents,
               ConservedBools conserved_bools)

{
  uint uVar1;
  string *psVar2;
  size_type sVar3;
  undefined8 uVar4;
  pointer ppVar5;
  Read<int> local_120;
  Read<int> local_110;
  Read<double> local_100;
  Read<double> local_f0;
  undefined1 local_e0 [8];
  Read<double> new_elem_densities;
  Read<double> old_elem_densities;
  Tag<double> *old_tag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> error_name;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  string local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> integral_name;
  string local_60 [8];
  string density_name;
  Int dim;
  LOs *same_ents2old_ents_local;
  TagBase *tagbase_local;
  CavsByBdryStatus *cavs_local;
  Mesh *new_mesh_local;
  TransferOpts *opts_local;
  Mesh *old_mesh_local;
  
  uVar1 = Mesh::dim(old_mesh);
  psVar2 = TagBase::name_abi_cxx11_(tagbase);
  std::__cxx11::string::string(local_60,(string *)psVar2);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&opts->integral_map,(key_type *)local_60);
  if (sVar3 == 0) {
    uVar4 = std::__cxx11::string::c_str();
    fail("integral_map[\"%s\"] undefined\n",uVar4);
  }
  local_98._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&opts->integral_map,(key_type *)local_60);
  ppVar5 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_98);
  std::__cxx11::string::string(local_90,(string *)&ppVar5->second);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&old_tag,
                 (char *)local_90);
  as<double>(tagbase);
  Tag<double>::array((Tag<double> *)&new_elem_densities.write_.shared_alloc_.direct_ptr);
  TagBase::name_abi_cxx11_(tagbase);
  Mesh::get_array<double>((Mesh *)local_e0,(Int)new_mesh,(string *)(ulong)uVar1);
  Read<double>::Read(&local_f0,(Read<double> *)&new_elem_densities.write_.shared_alloc_.direct_ptr);
  Read<double>::Read(&local_100,(Read<double> *)local_e0);
  Read<int>::Read(&local_110,same_ents2old_ents);
  Read<int>::Read(&local_120,same_ents2new_ents);
  transfer_integ_error
            (old_mesh,new_mesh,cavs,&local_f0,&local_100,(string *)&old_tag,&local_110,&local_120,
             conserved_bools);
  Read<int>::~Read(&local_120);
  Read<int>::~Read(&local_110);
  Read<double>::~Read(&local_100);
  Read<double>::~Read(&local_f0);
  Read<double>::~Read((Read<double> *)local_e0);
  Read<double>::~Read((Read<double> *)&new_elem_densities.write_.shared_alloc_.direct_ptr);
  std::__cxx11::string::~string((string *)&old_tag);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

static void transfer_density_error(Mesh* old_mesh, TransferOpts const& opts,
    Mesh* new_mesh, CavsByBdryStatus const& cavs, TagBase const* tagbase,
    LOs same_ents2old_ents, LOs same_ents2new_ents,
    ConservedBools conserved_bools) {
  auto dim = old_mesh->dim();
  auto density_name = tagbase->name();
  if (!opts.integral_map.count(density_name)) {
    Omega_h_fail("integral_map[\"%s\"] undefined\n", density_name.c_str());
  }
  auto integral_name = opts.integral_map.find(density_name)->second;
  auto error_name = integral_name + "_error";
  auto old_tag = as<Real>(tagbase);
  auto old_elem_densities = old_tag->array();
  auto new_elem_densities = new_mesh->get_array<Real>(dim, tagbase->name());
  transfer_integ_error(old_mesh, new_mesh, cavs, old_elem_densities,
      new_elem_densities, error_name, same_ents2old_ents, same_ents2new_ents,
      conserved_bools);
}